

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_singleton.c
# Opt level: O0

log_singleton log_singleton_create(void)

{
  log_singleton __ptr;
  log_map plVar1;
  log_singleton s;
  size_t in_stack_fffffffffffffff8;
  
  __ptr = (log_singleton)malloc(8);
  if (__ptr == (log_singleton)0x0) {
    __ptr = (log_singleton)0x0;
  }
  else {
    plVar1 = log_map_create(in_stack_fffffffffffffff8);
    __ptr->map = plVar1;
    if (__ptr->map == (log_map)0x0) {
      free(__ptr);
      __ptr = (log_singleton)0x0;
    }
  }
  return __ptr;
}

Assistant:

log_singleton log_singleton_create(void)
{
	log_singleton s = malloc(sizeof(struct log_singleton_type));

	if (s == NULL)
	{
		return NULL;
	}

	s->map = log_map_create(LOG_SINGLETON_MAP_SIZE);

	if (s->map == NULL)
	{
		free(s);

		return NULL;
	}

	return s;
}